

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testanimators.cpp
# Opt level: O0

Am_Wrapper * which_way_proc(Am_Object *self)

{
  int iVar1;
  Am_Value *this;
  Am_Object local_38;
  Am_Object local_30;
  Am_Object local_28;
  int local_1c;
  Am_Object *pAStack_18;
  int x_offset;
  Am_Object *self_local;
  
  pAStack_18 = self;
  Am_Object::Get_Object((ushort)&local_38,(ulong)self);
  Am_Object::Get_Object((ushort)&local_30,(ulong)&local_38);
  Am_Object::Get_Object((ushort)&local_28,(ulong)&local_30);
  this = (Am_Value *)Am_Object::Get((ushort)&local_28,0x11d);
  iVar1 = Am_Value::operator_cast_to_int(this);
  Am_Object::~Am_Object(&local_28);
  Am_Object::~Am_Object(&local_30);
  Am_Object::~Am_Object(&local_38);
  local_1c = iVar1;
  if (iVar1 < 1) {
    self_local = (Am_Object *)
                 Am_Value_List::operator_cast_to_Am_Wrapper_((Am_Value_List *)eye_walking_left);
  }
  else {
    self_local = (Am_Object *)
                 Am_Value_List::operator_cast_to_Am_Wrapper_((Am_Value_List *)eye_walking_right);
  }
  return (Am_Wrapper *)self_local;
}

Assistant:

Am_Define_Value_List_Formula(which_way)
{
  int x_offset = self.Get_Object(Am_OPERATES_ON)
                     .Get_Object(WALKER)
                     .Get_Object(Am_COMMAND)
                     .Get(Am_X_OFFSET);
  if (x_offset > 0)
    return eye_walking_right;
  else
    return eye_walking_left;
}